

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O0

void __thiscall
test_matrix_dense_matrix_matrix_multiplication_assignment_Test::TestBody
          (test_matrix_dense_matrix_matrix_multiplication_assignment_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  reference pvVar5;
  char *pcVar6;
  array<double,_2UL> *paVar7;
  reference pvVar8;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *regex_02;
  Vector_Dense<double,_0UL> *local_d30;
  Vector_Dense<double,_0UL> *local_d18;
  Vector_Dense<double,_0UL> *local_c38;
  Vector_Dense<double,_0UL> *local_b30;
  Vector_Dense<double,_0UL> *local_b18;
  AssertHelper local_b10;
  Message local_b08 [6];
  exception *gtest_exception_3;
  ReturnSentinel gtest_sentinel_3;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_3;
  pointer local_ab0;
  DeathTest *gtest_dt_3;
  Message local_aa0 [6];
  exception *gtest_exception_2;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_a48;
  DeathTest *gtest_dt_2;
  Message local_a38 [6];
  exception *gtest_exception_1;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_9e0;
  DeathTest *gtest_dt_1;
  Message local_9d0;
  int local_9c4;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_970;
  DeathTest *gtest_dt;
  Matrix_Dense<double,_2UL,_3UL> incorrect;
  Message local_930;
  undefined1 local_928 [8];
  AssertionResult gtest_ar_29;
  Message local_910;
  undefined1 local_908 [8];
  AssertionResult gtest_ar_28;
  Message local_8f0;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar_27;
  Message local_8d0;
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar_26;
  Message local_8b0;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar_25;
  Message local_890;
  undefined1 local_888 [8];
  AssertionResult gtest_ar_24;
  Message local_870;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_23;
  Message local_850;
  undefined1 local_848 [8];
  AssertionResult gtest_ar_22;
  Message local_830;
  undefined1 local_828 [8];
  AssertionResult gtest_ar_21;
  Message local_810;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_20;
  Message local_7f0;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_19;
  Message local_7d0;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar_18;
  Message local_7b0;
  int local_7a4;
  size_t local_7a0;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_17;
  Message local_780;
  int local_774;
  size_t local_770;
  undefined1 local_768 [8];
  AssertionResult gtest_ar_16;
  initializer_list<double> local_738;
  double local_728 [5];
  initializer_list<double> local_700;
  Vector_Dense<double,_0UL> *local_6f0;
  Vector_Dense<double,_0UL> local_6e8;
  Vector_Dense<double,_0UL> local_6d0;
  undefined1 local_6b8 [40];
  double local_690 [2];
  initializer_list<double> local_680;
  double local_670 [2];
  initializer_list<double> local_660;
  double local_650 [2];
  initializer_list<double> local_640;
  Vector_Dense<double,_0UL> *local_630;
  Vector_Dense<double,_0UL> local_628;
  Vector_Dense<double,_0UL> local_610;
  Vector_Dense<double,_0UL> local_5f8;
  undefined1 local_5e0 [40];
  AssertHelper local_5b8;
  Message local_5b0;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_15;
  Message local_590;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_14;
  Message local_570;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_13;
  Message local_550;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_12;
  Message local_530;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_11;
  Message local_510;
  undefined1 local_508 [8];
  AssertionResult gtest_ar_10;
  Message local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_9;
  Message local_4d0;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_8;
  initializer_list<double> local_4a8;
  double local_498 [2];
  initializer_list<double> local_488;
  Vector_Dense<double,_2UL> local_478;
  Vector_Dense<double,_2UL> local_468;
  initializer_list<Disa::Vector_Dense<double,_2UL>_> local_458;
  Matrix_Dense<double,_2UL,_2UL> local_448;
  double local_428 [2];
  initializer_list<double> local_418;
  double local_408 [2];
  initializer_list<double> local_3f8;
  Vector_Dense<double,_0UL> *local_3e8;
  Vector_Dense<double,_0UL> local_3e0;
  Vector_Dense<double,_0UL> local_3c8;
  undefined1 local_3b0 [40];
  AssertHelper local_388;
  Message local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_7;
  Message local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_6;
  Message local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_5;
  Message local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_4;
  Message local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_3;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_2;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_1;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar;
  initializer_list<double> local_278;
  double local_268 [2];
  initializer_list<double> local_258;
  Vector_Dense<double,_2UL> local_248;
  Vector_Dense<double,_2UL> local_238;
  initializer_list<Disa::Vector_Dense<double,_2UL>_> local_228;
  undefined1 local_218 [8];
  Matrix_Dense<double,_2UL,_2UL> static_matrix_1;
  initializer_list<double> local_1e8;
  double local_1d8 [2];
  initializer_list<double> local_1c8;
  Vector_Dense<double,_2UL> local_1b8;
  Vector_Dense<double,_2UL> local_1a8;
  initializer_list<Disa::Vector_Dense<double,_2UL>_> local_198;
  undefined1 auStack_188 [8];
  Matrix_Dense<double,_2UL,_2UL> static_matrix_0;
  double local_160 [2];
  initializer_list<double> local_150;
  double local_140 [2];
  initializer_list<double> local_130;
  Vector_Dense<double,_0UL> *local_120;
  Vector_Dense<double,_0UL> local_118;
  Vector_Dense<double,_0UL> local_100;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix_1;
  initializer_list<double> local_b0 [2];
  double local_90 [2];
  initializer_list<double> local_80;
  Vector_Dense<double,_0UL> *local_70;
  Vector_Dense<double,_0UL> local_68;
  Vector_Dense<double,_0UL> local_50;
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix_0;
  test_matrix_dense_matrix_matrix_multiplication_assignment_Test *this_local;
  
  local_70 = &local_68;
  local_90[0] = 1.0;
  local_90[1] = 2.0;
  local_80._M_array = local_90;
  local_80._M_len = 2;
  dynamic_matrix_0.
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_70,&local_80);
  local_70 = &local_50;
  dynamic_matrix_1.
  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  local_b0[0]._M_array =
       (iterator)
       &dynamic_matrix_1.
        super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
        .
        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b0[0]._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_70,local_b0);
  local_38._0_8_ = &local_68;
  local_38._8_8_ = (pointer)0x2;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)local_28,
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)local_38);
  local_b18 = (Vector_Dense<double,_0UL> *)local_38;
  do {
    local_b18 = local_b18 + -1;
    Disa::Vector_Dense<double,_0UL>::~Vector_Dense(local_b18);
  } while (local_b18 != &local_68);
  local_120 = &local_118;
  local_140[0] = 5.0;
  local_140[1] = 6.0;
  local_130._M_array = local_140;
  local_130._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_120,&local_130);
  local_120 = &local_100;
  local_160[0] = 7.0;
  local_160[1] = 8.0;
  local_150._M_array = local_160;
  local_150._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_120,&local_150);
  local_e8._0_8_ = &local_118;
  local_e8._8_8_ = (pointer)0x2;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)local_d8,
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)local_e8);
  local_b30 = (Vector_Dense<double,_0UL> *)local_e8;
  do {
    local_b30 = local_b30 + -1;
    Disa::Vector_Dense<double,_0UL>::~Vector_Dense(local_b30);
  } while (local_b30 != &local_118);
  local_1d8[0] = 1.0;
  local_1d8[1] = 2.0;
  local_1c8._M_array = local_1d8;
  local_1c8._M_len = 2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense(&local_1b8,&local_1c8);
  static_matrix_1.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
  super_array<double,_2UL>._M_elems[1] = 3.0;
  local_1e8._M_array =
       static_matrix_1.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
       super_array<double,_2UL>._M_elems + 1;
  local_1e8._M_len = 2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense(&local_1a8,&local_1e8);
  local_198._M_array = &local_1b8;
  local_198._M_len = 2;
  Disa::Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense
            ((Matrix_Dense<double,_2UL,_2UL> *)auStack_188,&local_198);
  local_268[0] = 5.0;
  local_268[1] = 6.0;
  local_258._M_array = local_268;
  local_258._M_len = 2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense(&local_248,&local_258);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x401c000000000000;
  local_278._M_array = (iterator)&gtest_ar.message_;
  local_278._M_len = 2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense(&local_238,&local_278);
  local_228._M_array = &local_248;
  local_228._M_len = 2;
  Disa::Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense
            ((Matrix_Dense<double,_2UL,_2UL> *)local_218,&local_228);
  Disa::Matrix_Dense<double,0ul,0ul>::operator*=
            ((Matrix_Dense<double,0ul,0ul> *)local_28,(Matrix_Dense<double,_0UL,_0UL> *)local_d8);
  Disa::Matrix_Dense<double,2ul,2ul>::operator*=
            ((Matrix_Dense<double,2ul,2ul> *)auStack_188,(Matrix_Dense<double,_2UL,_2UL> *)local_218
            );
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,0)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_298,"dynamic_matrix_0[0][0]","19",*pvVar5,19.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfb,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,0)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2b8,"dynamic_matrix_0[0][1]","22",*pvVar5,22.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfc,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,1)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2d8,"dynamic_matrix_0[1][0]","43",*pvVar5,43.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfd,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,1)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2f8,"dynamic_matrix_0[1][1]","50",*pvVar5,50.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfe,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  paVar7 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)auStack_188,0)->
            super_array<double,_2UL>;
  pvVar8 = std::array<double,_2UL>::operator[](paVar7,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_318,"static_matrix_0[0][0]","19",*pvVar8,19.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xff,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  paVar7 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)auStack_188,0)->
            super_array<double,_2UL>;
  pvVar8 = std::array<double,_2UL>::operator[](paVar7,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_338,"static_matrix_0[0][1]","22",*pvVar8,22.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x100,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  paVar7 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)auStack_188,1)->
            super_array<double,_2UL>;
  pvVar8 = std::array<double,_2UL>::operator[](paVar7,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_358,"static_matrix_0[1][0]","43",*pvVar8,43.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x101,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  paVar7 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)auStack_188,1)->
            super_array<double,_2UL>;
  pvVar8 = std::array<double,_2UL>::operator[](paVar7,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_378,"static_matrix_0[1][1]","50",*pvVar8,50.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x102,pcVar6);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_3e8 = &local_3e0;
  local_408[0] = 1.0;
  local_408[1] = 2.0;
  local_3f8._M_array = local_408;
  local_3f8._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_3e8,&local_3f8);
  local_3e8 = &local_3c8;
  local_428[0] = 3.0;
  local_428[1] = 4.0;
  local_418._M_array = local_428;
  local_418._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_3e8,&local_418);
  local_3b0._0_8_ = &local_3e0;
  local_3b0._8_8_ = (pointer)0x2;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_3b0 + 0x10),
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)local_3b0);
  Disa::Matrix_Dense<double,_0UL,_0UL>::operator=
            ((Matrix_Dense<double,_0UL,_0UL> *)local_28,
             (Matrix_Dense<double,_0UL,_0UL> *)(local_3b0 + 0x10));
  Disa::Matrix_Dense<double,_0UL,_0UL>::~Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_3b0 + 0x10));
  local_c38 = (Vector_Dense<double,_0UL> *)local_3b0;
  do {
    local_c38 = local_c38 + -1;
    Disa::Vector_Dense<double,_0UL>::~Vector_Dense(local_c38);
  } while (local_c38 != &local_3e0);
  local_498[0] = 1.0;
  local_498[1] = 2.0;
  local_488._M_array = local_498;
  local_488._M_len = 2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense(&local_478,&local_488);
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  local_4a8._M_array = (iterator)&gtest_ar_8.message_;
  local_4a8._M_len = 2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense(&local_468,&local_4a8);
  local_458._M_array = &local_478;
  local_458._M_len = 2;
  Disa::Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense(&local_448,&local_458);
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[1] =
       local_448.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
       super_array<double,_2UL>._M_elems[0];
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
  super_array<double,_2UL>._M_elems[0] =
       local_448.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
       super_array<double,_2UL>._M_elems[1];
  auStack_188 = (undefined1  [8])
                local_448.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
                super_array<double,_2UL>._M_elems[0];
  static_matrix_0.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
  super_array<double,_2UL>._M_elems[0] =
       local_448.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].
       super_array<double,_2UL>._M_elems[1];
  Disa::Matrix_Dense<double,0ul,0ul>::operator*=
            ((Matrix_Dense<double,0ul,0ul> *)local_28,(Matrix_Dense<double,_2UL,_2UL> *)local_218);
  Disa::Matrix_Dense<double,2ul,2ul>::operator*=
            ((Matrix_Dense<double,2ul,2ul> *)auStack_188,(Matrix_Dense<double,_0UL,_0UL> *)local_d8)
  ;
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,0)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_4c8,"dynamic_matrix_0[0][0]","19",*pvVar5,19.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x109,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,0)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_4e8,"dynamic_matrix_0[0][1]","22",*pvVar5,22.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,1)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_508,"dynamic_matrix_0[1][0]","43",*pvVar5,43.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,1)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_528,"dynamic_matrix_0[1][1]","50",*pvVar5,50.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10c,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  paVar7 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)auStack_188,0)->
            super_array<double,_2UL>;
  pvVar8 = std::array<double,_2UL>::operator[](paVar7,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_548,"static_matrix_0[0][0]","19",*pvVar8,19.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  paVar7 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)auStack_188,0)->
            super_array<double,_2UL>;
  pvVar8 = std::array<double,_2UL>::operator[](paVar7,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_568,"static_matrix_0[0][1]","22",*pvVar8,22.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_570);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  paVar7 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)auStack_188,1)->
            super_array<double,_2UL>;
  pvVar8 = std::array<double,_2UL>::operator[](paVar7,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_588,"static_matrix_0[1][0]","43",*pvVar8,43.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_590);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  paVar7 = &std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[]
                      ((array<Disa::Vector_Dense<double,_2UL>,_2UL> *)auStack_188,1)->
            super_array<double,_2UL>;
  pvVar8 = std::array<double,_2UL>::operator[](paVar7,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_5a8,"static_matrix_0[1][1]","50",*pvVar8,50.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5b0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x110,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
    testing::internal::AssertHelper::~AssertHelper(&local_5b8);
    testing::Message::~Message(&local_5b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  local_630 = &local_628;
  local_650[0] = 1.0;
  local_650[1] = 2.0;
  local_640._M_array = local_650;
  local_640._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_630,&local_640);
  local_630 = &local_610;
  local_670[0] = 3.0;
  local_670[1] = 4.0;
  local_660._M_array = local_670;
  local_660._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_630,&local_660);
  local_630 = &local_5f8;
  local_690[0] = 5.0;
  local_690[1] = 6.0;
  local_680._M_array = local_690;
  local_680._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_630,&local_680);
  local_5e0._0_8_ = &local_628;
  local_5e0._8_8_ = (pointer)0x3;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_5e0 + 0x10),
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)local_5e0);
  Disa::Matrix_Dense<double,_0UL,_0UL>::operator=
            ((Matrix_Dense<double,_0UL,_0UL> *)local_28,
             (Matrix_Dense<double,_0UL,_0UL> *)(local_5e0 + 0x10));
  Disa::Matrix_Dense<double,_0UL,_0UL>::~Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_5e0 + 0x10));
  local_d18 = (Vector_Dense<double,_0UL> *)local_5e0;
  do {
    local_d18 = local_d18 + -1;
    Disa::Vector_Dense<double,_0UL>::~Vector_Dense(local_d18);
  } while (local_d18 != &local_628);
  local_6f0 = &local_6e8;
  local_728[2] = 9.0;
  local_728[3] = 10.0;
  local_728[0] = 7.0;
  local_728[1] = 8.0;
  local_700._M_array = local_728;
  local_700._M_len = 4;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_6f0,&local_700);
  local_6f0 = &local_6d0;
  gtest_ar_16.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4026000000000000;
  local_738._M_array = (iterator)&gtest_ar_16.message_;
  local_738._M_len = 4;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(local_6f0,&local_738);
  local_6b8._0_8_ = &local_6e8;
  local_6b8._8_8_ = (pointer)0x2;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_6b8 + 0x10),
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)local_6b8);
  Disa::Matrix_Dense<double,_0UL,_0UL>::operator=
            ((Matrix_Dense<double,_0UL,_0UL> *)local_d8,
             (Matrix_Dense<double,_0UL,_0UL> *)(local_6b8 + 0x10));
  Disa::Matrix_Dense<double,_0UL,_0UL>::~Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)(local_6b8 + 0x10));
  local_d30 = (Vector_Dense<double,_0UL> *)local_6b8;
  do {
    local_d30 = local_d30 + -1;
    Disa::Vector_Dense<double,_0UL>::~Vector_Dense(local_d30);
  } while (local_d30 != &local_6e8);
  Disa::Matrix_Dense<double,0ul,0ul>::operator*=
            ((Matrix_Dense<double,0ul,0ul> *)local_28,(Matrix_Dense<double,_0UL,_0UL> *)local_d8);
  local_770 = Disa::Matrix_Dense<double,_0UL,_0UL>::size_row
                        ((Matrix_Dense<double,_0UL,_0UL> *)local_28);
  local_774 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_768,"dynamic_matrix_0.size_row()","3",&local_770,&local_774);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_768);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x116,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
  local_7a0 = Disa::Matrix_Dense<double,_0UL,_0UL>::size_column
                        ((Matrix_Dense<double,_0UL,_0UL> *)local_28);
  local_7a4 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_798,"dynamic_matrix_0.size_column()","4",&local_7a0,&local_7a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(&local_7b0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x117,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_7b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,0)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_7c8,"dynamic_matrix_0[0][0]","29",*pvVar5,29.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x118,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,0)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_7e8,"dynamic_matrix_0[0][1]","32",*pvVar5,32.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_7f0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x119,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,0)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_808,"dynamic_matrix_0[0][2]","35",*pvVar5,35.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar1) {
    testing::Message::Message(&local_810);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,0)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,3);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_828,"dynamic_matrix_0[0][3]","38",*pvVar5,38.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
  if (!bVar1) {
    testing::Message::Message(&local_830);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_830);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,1)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_848,"dynamic_matrix_0[1][0]","65",*pvVar5,65.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
  if (!bVar1) {
    testing::Message::Message(&local_850);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_848);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11c,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_850);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,1)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_868,"dynamic_matrix_0[1][1]","72",*pvVar5,72.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar1) {
    testing::Message::Message(&local_870);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_870);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,1)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_888,"dynamic_matrix_0[1][2]","79",*pvVar5,79.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_888);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_888);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_890);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_888);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,1)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,3);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_8a8,"dynamic_matrix_0[1][3]","86",*pvVar5,86.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a8);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_8a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,2)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_8c8,"dynamic_matrix_0[2][0]","101",*pvVar5,101.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c8);
  if (!bVar1) {
    testing::Message::Message(&local_8d0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_8c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x120,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_8d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_8d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,2)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_8e8,"dynamic_matrix_0[2][1]","112",*pvVar5,112.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_8e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x121,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,2)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_908,"dynamic_matrix_0[2][2]","123",*pvVar5,123.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar1) {
    testing::Message::Message(&local_910);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_908);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x122,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_910);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_910);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  pvVar4 = &std::
            vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                          *)local_28,2)->super_vector<double,_std::allocator<double>_>;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,3);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_928,"dynamic_matrix_0[2][3]","134",*pvVar5,134.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar1) {
    testing::Message::Message(&local_930);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_928);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[1].
                super_array<double,_3UL>._M_elems + 2),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x123,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[1].
                super_array<double,_3UL>._M_elems + 2),&local_930);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               (incorrect.super_array<Disa::Vector_Dense<double,_3UL>,_2UL>._M_elems[1].
                super_array<double,_3UL>._M_elems + 2));
    testing::Message::~Message(&local_930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  Disa::Matrix_Dense<double,_0UL,_0UL>::resize((Matrix_Dense<double,_0UL,_0UL> *)local_28,1,1);
  Disa::Matrix_Dense<double,_2UL,_3UL>::Matrix_Dense((Matrix_Dense<double,_2UL,_3UL> *)&gtest_dt);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("dynamic_matrix_1 *= incorrect",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x127,&local_970);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00120b46;
    if (local_970 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_970);
      iVar2 = (*local_970->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_970->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_970->_vptr_DeathTest[4])(local_970,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00120b08;
        local_9c4 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_970);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Disa::Matrix_Dense<double,0ul,0ul>::operator*=
                      ((Matrix_Dense<double,0ul,0ul> *)local_d8,
                       (Matrix_Dense<double,_2UL,_3UL> *)&gtest_dt);
          }
          (*local_970->_vptr_DeathTest[5])(local_970,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_00120b08:
        local_9c4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_9c4 != 0) goto LAB_00120b46;
    }
  }
  else {
LAB_00120b46:
    testing::Message::Message(&local_9d0);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x127,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_9d0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)"./*",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("dynamic_matrix_1 *= dynamic_matrix_0",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x128,&local_9e0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00120fb6;
    if (local_9e0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_9e0);
      iVar2 = (*local_9e0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_9e0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_9e0->_vptr_DeathTest[4])(local_9e0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00120f78;
        local_9c4 = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_1,local_9e0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Disa::Matrix_Dense<double,0ul,0ul>::operator*=
                      ((Matrix_Dense<double,0ul,0ul> *)local_d8,
                       (Matrix_Dense<double,_0UL,_0UL> *)local_28);
          }
          (*local_9e0->_vptr_DeathTest[5])(local_9e0,2);
          local_9c4 = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_1);
        }
LAB_00120f78:
        local_9c4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_9c4 != 0) goto LAB_00120fb6;
    }
  }
  else {
LAB_00120fb6:
    testing::Message::Message(local_a38);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x128,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_2,local_a38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_2);
    testing::Message::~Message(local_a38);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2,(internal *)"./*",regex_01);
    bVar1 = testing::internal::DeathTest::Create
                      ("static_matrix_0 *= incorrect",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x129,&local_a48);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00121429;
    if (local_a48 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_2,local_a48);
      iVar2 = (*local_a48->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_a48->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_a48->_vptr_DeathTest[4])(local_a48,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_001213eb;
        local_9c4 = 6;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_2,local_a48);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Disa::Matrix_Dense<double,2ul,2ul>::operator*=
                      ((Matrix_Dense<double,2ul,2ul> *)auStack_188,
                       (Matrix_Dense<double,_2UL,_3UL> *)&gtest_dt);
          }
          (*local_a48->_vptr_DeathTest[5])(local_a48,2);
          local_9c4 = 7;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_2);
        }
LAB_001213eb:
        local_9c4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_2);
      if (local_9c4 != 0) goto LAB_00121429;
    }
  }
  else {
LAB_00121429:
    testing::Message::Message(local_aa0);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x129,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_3,local_aa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_3);
    testing::Message::~Message(local_aa0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3,(internal *)"./*",regex_02);
    bVar1 = testing::internal::DeathTest::Create
                      ("static_matrix_0 *= dynamic_matrix_0",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x12a,&local_ab0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_ab0 == (pointer)0x0) goto LAB_0012194a;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_3,local_ab0);
      iVar2 = (*local_ab0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_ab0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_ab0->_vptr_DeathTest[4])(local_ab0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0012185b;
        local_9c4 = 8;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_3,local_ab0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Disa::Matrix_Dense<double,2ul,2ul>::operator*=
                      ((Matrix_Dense<double,2ul,2ul> *)auStack_188,
                       (Matrix_Dense<double,_0UL,_0UL> *)local_28);
          }
          (*local_ab0->_vptr_DeathTest[5])(local_ab0,2);
          local_9c4 = 9;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_3);
        }
LAB_0012185b:
        local_9c4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_3);
      if (local_9c4 == 0) goto LAB_0012194a;
    }
  }
  testing::Message::Message(local_b08);
  pcVar6 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_b10,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
             ,0x12a,pcVar6);
  testing::internal::AssertHelper::operator=(&local_b10,local_b08);
  testing::internal::AssertHelper::~AssertHelper(&local_b10);
  testing::Message::~Message(local_b08);
LAB_0012194a:
  Disa::Matrix_Dense<double,_0UL,_0UL>::~Matrix_Dense((Matrix_Dense<double,_0UL,_0UL> *)local_d8);
  Disa::Matrix_Dense<double,_0UL,_0UL>::~Matrix_Dense((Matrix_Dense<double,_0UL,_0UL> *)local_28);
  return;
}

Assistant:

TEST(test_matrix_dense, matrix_matrix_multiplication_assignment) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_1 = {{5, 6}, {7, 8}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_1 = {{5, 6}, {7, 8}};

  dynamic_matrix_0 *= dynamic_matrix_1;
  static_matrix_0 *= static_matrix_1;
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 50);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][1], 50);

  // reset
  dynamic_matrix_0 = {{1, 2}, {3, 4}};
  static_matrix_0 = {{1, 2}, {3, 4}};
  dynamic_matrix_0 *= static_matrix_1;
  static_matrix_0 *= dynamic_matrix_1;
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 50);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][1], 50);

  // non-square
  dynamic_matrix_0 = {{1, 2}, {3, 4}, {5, 6}};
  dynamic_matrix_1 = {{7, 8, 9, 10}, {11, 12, 13, 14}};
  dynamic_matrix_0 *= dynamic_matrix_1;
  EXPECT_EQ(dynamic_matrix_0.size_row(), 3);
  EXPECT_EQ(dynamic_matrix_0.size_column(), 4);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 29);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 32);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][2], 35);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][3], 38);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 65);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 72);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][2], 79);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][3], 86);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][0], 101);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][1], 112);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][2], 123);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][3], 134);

  dynamic_matrix_0.resize(1, 1);
  Matrix_Dense<Scalar, 2, 3> incorrect;
  EXPECT_DEATH(dynamic_matrix_1 *= incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_1 *= dynamic_matrix_0, "./*");
  EXPECT_DEATH(static_matrix_0 *= incorrect, "./*");
  EXPECT_DEATH(static_matrix_0 *= dynamic_matrix_0, "./*");
}